

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void seterrorobj(lua_State *L,int errcode,StkId oldtop)

{
  StkId pTVar1;
  int iVar2;
  undefined4 uVar3;
  TString *pTVar4;
  TValue *io;
  
  if (errcode == 6) {
    pTVar4 = luaS_newlstr(L,"error in error handling",0x17);
  }
  else {
    if (errcode != 4) {
      pTVar1 = L->top;
      iVar2 = pTVar1[-1].tt_;
      uVar3 = *(undefined4 *)&pTVar1[-1].field_0xc;
      oldtop->value_ = pTVar1[-1].value_;
      oldtop->tt_ = iVar2;
      *(undefined4 *)&oldtop->field_0xc = uVar3;
      goto LAB_00109827;
    }
    pTVar4 = L->l_G->memerrmsg;
  }
  (oldtop->value_).gc = (GCObject *)pTVar4;
  oldtop->tt_ = pTVar4->tt | 0x40;
LAB_00109827:
  L->top = oldtop + 1;
  return;
}

Assistant:

static void seterrorobj(lua_State *L, int errcode, StkId oldtop) {
    switch (errcode) {
        case LUA_ERRMEM: {  /* memory error? */
            setsvalue2s(L, oldtop, G(L)->memerrmsg); /* reuse preregistered msg. */
            break;
        }
        case LUA_ERRERR: {
            setsvalue2s(L, oldtop, luaS_newliteral(L, "error in error handling"));
            break;
        }
        default: {
            setobjs2s(L, oldtop, L->top - 1);  /* error message on current top */
            break;
        }
    }
    L->top = oldtop + 1;
}